

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

BeliefSet * __thiscall AlphaVectorPlanning::SampleBeliefs(AlphaVectorPlanning *this,Arguments *args)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  PlanningUnitDecPOMDPDiscrete *pPVar4;
  size_t sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  long *plVar7;
  DecPOMDPDiscreteInterface *pDVar8;
  MultiAgentDecisionProcessDiscreteInterface *pMVar9;
  undefined8 uVar10;
  PlanningUnitMADPDiscreteParameters *this_00;
  value_type pJVar11;
  void *this_01;
  reference ppJVar12;
  long in_RDX;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_RDI;
  double dVar13;
  double dVar14;
  int j_1;
  int j;
  double qQMDP;
  int aQMDP;
  double valMax;
  QMDP *qmdp;
  int nrEqualFound;
  bool addBelief;
  bool equal;
  bool foundEqualBelief;
  BeliefSet S;
  JointBeliefInterface *b1;
  JointBeliefInterface *b0;
  JointBeliefInterface *b1p;
  JointBeliefInterface *b0p;
  Index s1;
  Index s0;
  Index o;
  Index a;
  int s;
  int d;
  int i;
  int nrA;
  int nrS;
  int h;
  int resetAfter;
  BeliefSet *S1;
  AlphaVectorPlanning *in_stack_fffffffffffffd48;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffd50;
  allocator_type *in_stack_fffffffffffffd60;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffd68;
  QMDP *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  E *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  int local_108;
  allocator_type local_103;
  undefined1 local_102;
  undefined1 local_101 [37];
  int local_dc;
  double local_d8;
  int local_cc;
  double local_c8;
  long *local_c0;
  int local_b8;
  bool local_b4;
  byte local_b3;
  byte local_b2;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> local_b0;
  long *local_98;
  long *local_90;
  long *local_88;
  long *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  allocator<char> local_39;
  string local_38 [32];
  long local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (allocator<char> *)in_stack_fffffffffffffd80);
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_50 = *(int *)(local_18 + 0x108);
  pPVar4 = GetPU(in_stack_fffffffffffffd48);
  sVar5 = PlanningUnit::GetHorizon((PlanningUnit *)pPVar4);
  local_54 = (int)sVar5;
  GetPU(in_stack_fffffffffffffd48);
  sVar5 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffd50);
  local_58 = (int)sVar5;
  GetPU(in_stack_fffffffffffffd48);
  sVar5 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x909118);
  local_5c = (int)sVar5;
  local_64 = 0;
  local_74 = 0;
  pPVar4 = GetPU(in_stack_fffffffffffffd48);
  iVar3 = (*(pPVar4->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar4,(long)local_58);
  local_80 = (long *)CONCAT44(extraout_var,iVar3);
  pPVar4 = GetPU(in_stack_fffffffffffffd48);
  iVar3 = (*(pPVar4->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar4,(long)local_58);
  local_98 = (long *)CONCAT44(extraout_var_00,iVar3);
  local_90 = local_80;
  local_88 = local_98;
  std::allocator<JointBeliefInterface_*>::allocator((allocator<JointBeliefInterface_*> *)0x9091d3);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
             in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68,
             in_stack_fffffffffffffd60);
  std::allocator<JointBeliefInterface_*>::~allocator((allocator<JointBeliefInterface_*> *)0x9091ff);
  local_b8 = 0;
  if (local_50 == 0) {
    if (local_54 == 999999) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "Warning: sampling beliefs for an infinite horizon ");
      poVar6 = std::operator<<(poVar6,"without reset.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    local_50 = local_54;
  }
  local_c0 = (long *)0x0;
  if (*(int *)(local_18 + 0x10c) != 0) {
    plVar7 = (long *)operator_new(0x70);
    GetPU(in_stack_fffffffffffffd48);
    QMDP::QMDP(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
    local_c0 = plVar7;
    (**(code **)(*plVar7 + 0x10))();
  }
  local_60 = 0;
  do {
    bVar1 = false;
    if (local_60 < *(int *)(local_18 + 0x100)) {
      bVar1 = SBORROW4(local_b8,*(int *)(local_18 + 0x100) * 2) !=
              local_b8 + *(int *)(local_18 + 0x100) * -2 < 0;
    }
    if (!bVar1) {
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      if (local_88 != (long *)0x0) {
        (**(code **)(*local_88 + 8))();
      }
      if (local_c0 != (long *)0x0) {
        (**(code **)(*local_c0 + 8))();
      }
      this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_02,in_stack_fffffffffffffd88,(allocator<char> *)in_stack_fffffffffffffd80);
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
      std::__cxx11::string::~string((string *)(local_101 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_101);
      if (local_60 < *(int *)(local_18 + 0x100)) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "AlphaVectorPlanning::SampleBeliefs: warning, only ");
        poVar6 = std::operator<<(poVar6,"managed to sample ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_60);
        poVar6 = std::operator<<(poVar6," unique beliefs instead of ");
        this_01 = (void *)std::ostream::operator<<(poVar6,*(int *)(local_18 + 0x100));
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        local_102 = 0;
        in_stack_fffffffffffffd60 = &local_103;
        std::allocator<JointBeliefInterface_*>::allocator
                  ((allocator<JointBeliefInterface_*> *)0x909d29);
        std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
                  ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)poVar6
                   ,(size_type)this_01,in_stack_fffffffffffffd60);
        std::allocator<JointBeliefInterface_*>::~allocator
                  ((allocator<JointBeliefInterface_*> *)0x909d4f);
        for (local_108 = 0; local_108 != local_60; local_108 = local_108 + 1) {
          ppJVar12 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                     operator[](&local_b0,(long)local_108);
          pJVar11 = *ppJVar12;
          ppJVar12 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                     operator[](in_RDI,(long)local_108);
          *ppJVar12 = pJVar11;
        }
        local_102 = 1;
      }
      else {
        std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
                  ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                   in_stack_fffffffffffffd50,
                   (vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                   in_stack_fffffffffffffd48);
      }
      std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::~vector
                ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                 in_stack_fffffffffffffd60);
      return in_RDI;
    }
    if ((local_54 < local_64) || (local_50 < local_64)) {
      local_64 = 0;
    }
    if (local_64 == 0) {
      pPVar4 = GetPU(in_stack_fffffffffffffd48);
      pDVar8 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar4);
      local_78 = (**(code **)(*(long *)(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8)) +
                             0x160))(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8));
      plVar7 = (long *)((long)local_98 + *(long *)(*local_98 + -0xb8));
      GetPU(in_stack_fffffffffffffd48);
      pMVar9 = PlanningUnitMADPDiscrete::GetProblem((PlanningUnitMADPDiscrete *)0x90950c);
      uVar10 = (**(code **)((long)*pMVar9 + 0x50))();
      (**(code **)(*plVar7 + 0x28))(plVar7,uVar10);
    }
    else {
      if ((*(int *)(local_18 + 0x10c) == 0) ||
         (iVar3 = rand(), (double)iVar3 / 2147483648.0 <= *(double *)(local_18 + 0x110))) {
        dVar13 = (double)local_5c;
        iVar3 = rand();
        local_6c = (int)(dVar13 * ((double)iVar3 / 2147483648.0));
      }
      else {
        local_c8 = -1.79769313486232e+308;
        local_6c = 0x7fffffff;
        for (local_cc = 0; local_cc != local_5c; local_cc = local_cc + 1) {
          local_d8 = (double)(**(code **)(*local_c0 + 0x68))(local_c0,local_90,local_cc);
          if (local_c8 < local_d8) {
            local_6c = local_cc;
            local_c8 = local_d8;
          }
        }
      }
      pPVar4 = GetPU(in_stack_fffffffffffffd48);
      pDVar8 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar4);
      local_78 = (**(code **)(*(long *)(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8)) +
                             0x148))(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8),
                                     local_74,local_6c);
      pPVar4 = GetPU(in_stack_fffffffffffffd48);
      this_00 = PlanningUnitMADPDiscrete::GetParams(&pPVar4->super_PlanningUnitMADPDiscrete);
      bVar1 = PlanningUnitMADPDiscreteParameters::GetEventObservability(this_00);
      if (bVar1) {
        pPVar4 = GetPU(in_stack_fffffffffffffd48);
        pDVar8 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar4);
        local_70 = (**(code **)(*(long *)(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8)) +
                               0x158))(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8),
                                       local_74,local_6c,local_78);
      }
      else {
        pPVar4 = GetPU(in_stack_fffffffffffffd48);
        pDVar8 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar4);
        local_70 = (**(code **)(*(long *)(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8)) +
                               0x150))(&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8),
                                       local_6c,local_78);
      }
      (**(code **)(*local_98 + 0xa8))(local_98,local_90);
      plVar7 = local_98;
      pPVar4 = GetPU(in_stack_fffffffffffffd48);
      pDVar8 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar4);
      (**(code **)(*plVar7 + 0xb0))
                (plVar7,&pDVar8->field_0x0 + *(long *)(*(long *)pDVar8 + -0xb8),local_6c,local_70);
    }
    if (*(int *)(local_18 + 0xfc) == 0) {
      local_b4 = true;
    }
    else {
      local_b2 = 0;
      for (local_dc = 0; local_dc != local_60; local_dc = local_dc + 1) {
        local_b3 = 1;
        for (local_68 = 0; local_68 != local_58; local_68 = local_68 + 1) {
          ppJVar12 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                     operator[](&local_b0,(long)local_dc);
          pJVar11 = *ppJVar12;
          dVar13 = (double)(**(code **)(*(long *)((long)&pJVar11->field_0x0 +
                                                 *(long *)((long)*pJVar11 + -0xb8)) + 0x48))
                                     ((long)&pJVar11->field_0x0 + *(long *)((long)*pJVar11 + -0xb8),
                                      local_68);
          dVar14 = (double)(**(code **)(*(long *)((long)local_98 + *(long *)(*local_98 + -0xb8)) +
                                       0x48))((long)local_98 + *(long *)(*local_98 + -0xb8),local_68
                                             );
          if ((dVar13 != dVar14) || (NAN(dVar13) || NAN(dVar14))) {
            local_b3 = 0;
            break;
          }
        }
        if ((local_b3 & 1) != 0) {
          local_b2 = 1;
          break;
        }
      }
      local_b4 = (local_b2 & 1) == 0;
      if (!local_b4) {
        local_b8 = local_b8 + 1;
      }
    }
    if (local_b4 != false) {
      bVar2 = (**(code **)(*(long *)((long)local_98 + *(long *)(*local_98 + -0xb8)) + 0x78))
                        ((long)local_98 + *(long *)(*local_98 + -0xb8));
      if ((bVar2 & 1) == 0) {
        uVar10 = __cxa_allocate_exception(0x28);
        E::E(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        __cxa_throw(uVar10,&E::typeinfo,E::~E);
      }
      pJVar11 = (value_type)(**(code **)(*local_98 + 0xb8))();
      ppJVar12 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                 operator[](&local_b0,(long)local_60);
      *ppJVar12 = pJVar11;
      local_60 = local_60 + 1;
    }
    local_64 = local_64 + 1;
    local_74 = local_78;
    (**(code **)(*local_90 + 0xa8))(local_90,local_98);
  } while( true );
}

Assistant:

BeliefSet AlphaVectorPlanning::SampleBeliefs(
    const ArgumentHandlers::Arguments &args) const
{
    StartTimer("SampleBeliefs");
    
    int resetAfter=args.resetAfter;
    int h=GetPU()->GetHorizon(),
        nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        i,d=0,s;
    Index a;
    Index o;
    Index s0=0,s1;
    JointBeliefInterface *b0p, *b1p;
    b0p = GetPU()->GetNewJointBeliefInterface(nrS);
    b1p = GetPU()->GetNewJointBeliefInterface(nrS);
    JointBeliefInterface& b0 = *b0p;
    JointBeliefInterface& b1 = *b1p;
    BeliefSet S(args.nrBeliefs);
    bool foundEqualBelief,equal,addBelief;
    int nrEqualFound=0;

    // we don't want to artificially reset the problem
    if(resetAfter==0)
    {
        if(h==static_cast<int>(MAXHORIZON))
            cout << "Warning: sampling beliefs for an infinite horizon "
                 << "without reset." << endl;
        resetAfter=h;
    }

    QMDP *qmdp=0;
    if(args.useQMDPforSamplingBeliefs)
    {
        qmdp=new QMDP(GetPU());
        qmdp->Compute();
    }

    i=0;
    // make sure we don't try to keep on sampling beliefs if there are
    // not enough unique beliefs (<args.nrBeliefs)
    while(i<args.nrBeliefs && nrEqualFound<(args.nrBeliefs*2))
    {
        // reset the problem if either we exceeded the horizon, or the
        // user-supplied parameter (used in the infinite-horizon case)
        if(d>h || d>resetAfter)
            d=0;

        if(d==0)
        {
            s1=GetPU()->GetDPOMDPD()->SampleInitialState();
            b1.Set(* GetPU()->GetProblem()->GetISD());
        }
        else
        {
            if(args.useQMDPforSamplingBeliefs &&
               (rand() / (RAND_MAX + 1.0)) > args.QMDPexploreProb)
            {
                double valMax=-DBL_MAX;
                a=INT_MAX;
                for(int aQMDP=0;aQMDP!=nrA;++aQMDP)
                {
                    double qQMDP=qmdp->GetQ(b0,aQMDP);
                    if(qQMDP>valMax)
                    {
                        valMax=qQMDP;
                        a=aQMDP;
                    }
                }
            }
            else
            {
                // sample an action uniformly at random
                a=static_cast<int>(nrA*(rand() / (RAND_MAX + 1.0)));
            }

            s1=GetPU()->GetDPOMDPD()->SampleSuccessorState(s0,a);
            if(GetPU()->GetParams().GetEventObservability())
            {
                o=GetPU()->GetDPOMDPD()->SampleJointObservation(s0,a,s1);
            }
            else
            {
                o=GetPU()->GetDPOMDPD()->SampleJointObservation(a,s1);
            }
            b1=b0;
            b1.Update(*GetPU()->GetDPOMDPD(),a,o);
        }

        if(args.uniqueBeliefs)
        {
            foundEqualBelief=false;
            // loop over all beliefs already in S
            for(int j=0;j!=i;j++)
            {
                equal=true;
                for(s=0;s!=nrS;s++)
                {
                    // if one number differs we can move on to the next j
                    if(S[j]->Get(s)!=b1.Get(s))
                    {
                        equal=false;
                        break;
                    }
                }
                // if we found an equal belief we can stop
                if(equal)
                {
                    foundEqualBelief=true;
                    break;
                }
            }
            if(foundEqualBelief)
            {
                nrEqualFound++;
                addBelief=false;
            }
            else
                addBelief=true;
        }
        else
            addBelief=true;
        
        if(addBelief)
        {
            if(!b1.SanityCheck())
                throw(E("AlphaVectorPlanning::BeliefSampling belief fails sanity check"));

            S[i]=b1.Clone();
            i++;

            if(DEBUG_AlphaVectorPlanning_BeliefSampling)
            {
                cout << "AlphaVectorPlanning::SampleBeliefs sampled belief nr "
                     << i << "/" << args.nrBeliefs << " (nrEqualFound " 
                     << nrEqualFound << ")" << endl;
            }
        }
        
        d++;
        s0=s1;
        b0=b1;
    }

    delete b0p;
    delete b1p;
    delete qmdp;

    StopTimer("SampleBeliefs");

    // we did not manage to sample args.nrBeliefs unique beliefs
    if(i<args.nrBeliefs)
    {
        cout << "AlphaVectorPlanning::SampleBeliefs: warning, only " 
             << "managed to sample " << i << " unique beliefs instead of " 
             << args.nrBeliefs << endl;
        BeliefSet S1(i);
        for(int j=0;j!=i;j++)
            S1[j]=S[j];
        return(S1);
    }
    else
        return(S);
}